

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getCubeLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info,int faceNdx)

{
  int i;
  int iVar1;
  long lVar2;
  int iVar3;
  pointer pAVar4;
  long lVar5;
  IVec3 levelPixelSize;
  IVec3 levelTexelBlockSize;
  IVec3 size;
  TextureFormat format;
  IVec3 texelBlockPixelSize;
  int local_a8 [4];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_98;
  int local_90 [4];
  undefined8 local_80;
  int local_78;
  TextureFormat local_70;
  anon_unknown_0 local_64 [12];
  ConstPixelBufferAccess local_58;
  
  local_70 = glu::mapGLInternalFormat(info->m_format);
  local_78 = (info->m_size).m_data[2];
  local_80 = *(undefined8 *)(info->m_size).m_data;
  iVar1 = getTexelBlockSize(info->m_format);
  getTexelBlockPixelSize(local_64,info->m_format);
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar4 = (data->
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = __return_storage_ptr__;
  if (0 < (int)((ulong)((long)(data->
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) >> 4)) {
    local_90[3] = local_78;
    lVar5 = 0;
    do {
      local_a8[2] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      if (info->m_target == 0x8c1a) {
        lVar2 = 0;
        do {
          iVar3 = *(int *)((long)&local_80 + lVar2 * 4) >> ((byte)lVar5 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_a8[lVar2] = iVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        local_a8[2] = local_90[3];
      }
      else {
        lVar2 = 0;
        do {
          iVar3 = *(int *)((long)&local_80 + lVar2 * 4) >> ((byte)lVar5 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_a8[lVar2] = iVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
      }
      local_90[2] = 0;
      local_90[0] = 0;
      local_90[1] = 0;
      lVar2 = 0;
      do {
        local_90[lVar2] =
             (local_a8[lVar2] / *(int *)(local_64 + lVar2 * 4) + 1) -
             (uint)(local_a8[lVar2] % *(int *)(local_64 + lVar2 * 4) == 0);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_70,local_a8[0],local_a8[1],local_a8[2],
                 (void *)((long)(local_90[0] * iVar1 * faceNdx * local_90[1] * local_90[2]) +
                         (long)pAVar4[lVar5].m_ptr));
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      emplace_back<tcu::ConstPixelBufferAccess>(local_98,&local_58);
      lVar5 = lVar5 + 1;
      pAVar4 = (data->
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4)
                          >> 4));
  }
  return local_98;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getCubeLevelAccesses (const vector<ArrayBuffer<deUint8> >&	data,
														  const ImageInfo&						info,
														  int									faceNdx)
{
	const tcu::TextureFormat			format				= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size				= info.getSize();
	const int							texelBlockSize		= getTexelBlockSize(info.getFormat());
	const IVec3							texelBlockPixelSize = getTexelBlockPixelSize(info.getFormat());
	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT(info.getTarget() == GL_TEXTURE_CUBE_MAP);
	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelPixelSize			= getLevelSize(info.getTarget(), size, level);
		const IVec3	levelTexelBlockSize		= divRoundUp(levelPixelSize, texelBlockPixelSize);
		const int	levelTexelBlockCount	= levelTexelBlockSize.x() * levelTexelBlockSize.y() * levelTexelBlockSize.z();
		const int	levelSize				= levelTexelBlockCount * texelBlockSize;

		result.push_back(tcu::ConstPixelBufferAccess(format, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), data[level].getElementPtr(levelSize * faceNdx)));
	}

	return result;
}